

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O1

iterator __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::findNextMeshPoint
          (MultipleShootingTranscription *this,iterator *start)

{
  anon_struct_112_6_78b70dfe *paVar1;
  anon_struct_112_6_78b70dfe *paVar2;
  anon_struct_112_6_78b70dfe *paVar3;
  MeshPointOrigin ignored;
  long *local_58;
  long local_48 [2];
  long *local_38;
  long local_28 [2];
  int local_18;
  
  paVar2 = start->_M_current;
  MeshPointOrigin::Ignored();
  do {
    paVar3 = paVar2 + 1;
    paVar1 = paVar2 + 1;
    paVar2 = paVar3;
  } while ((paVar1->origin).m_priority == local_18);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return (iterator)paVar3;
}

Assistant:

std::vector<MeshPoint>::iterator findNextMeshPoint(const std::vector<MeshPoint>::iterator& start){
                std::vector<MeshPoint>::iterator nextMesh = start;
                MeshPointOrigin ignored = MeshPointOrigin::Ignored();
                assert(nextMesh != m_meshPoints.end());
                assert(nextMesh->origin.name().size() > 0);
                do {
                    ++nextMesh;
                    assert(nextMesh->origin.name().size() > 0);
                    assert(nextMesh != m_meshPoints.end());
                } while (nextMesh->origin == ignored); //find next valid mesh

                return nextMesh;
            }